

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O1

Context * __thiscall mp::Context::Add(Context *this,Context ct)

{
  CtxVal CVar1;
  bool bVar2;
  
  CVar1 = this->value_;
  if (CVar1 - CTX_ROOT < 2) {
    bVar2 = ct.value_ - CTX_NEG < 2;
  }
  else {
    if (CVar1 == CTX_NONE) goto LAB_00169374;
    if (CVar1 != CTX_NEG) {
      return this;
    }
    if (CTX_MIX < ct.value_) {
      return this;
    }
    bVar2 = (0x16U >> (ct.value_ & 0x1f) & 1) != 0;
  }
  ct.value_ = CTX_MIX;
  if (!bVar2) {
    return this;
  }
LAB_00169374:
  this->value_ = (CtxVal)ct;
  return this;
}

Assistant:

Context& Add(Context ct) {
    switch (value_) {          // Consider already stored value
    case CTX_NONE:
      value_ = ct.value_;
      break;
    case CTX_ROOT:
      MP_ASSERT(0, "Should not extend root context");
      [[fallthrough]];           // in release
    case CTX_POS:
      if (ct.HasNegative())
        value_ = CTX_MIX;
      break;
    case CTX_NEG:
      if (ct.HasPositive())
        value_ = CTX_MIX;
      break;
    default:
      break;
    }
    return *this;
  }